

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iostats.cpp
# Opt level: O0

summary<unsigned_int> * __thiscall
foxxll::stats_data::get_write_count_summary
          (summary<unsigned_int> *__return_storage_ptr__,stats_data *this)

{
  anon_class_1_0_00000001 local_19;
  stats_data *local_18;
  stats_data *this_local;
  
  local_18 = this;
  this_local = (stats_data *)__return_storage_ptr__;
  summary<unsigned_int>::summary<foxxll::stats_data::get_write_count_summary()const::__0>
            (__return_storage_ptr__,&this->file_stats_data_list_,&local_19);
  return __return_storage_ptr__;
}

Assistant:

stats_data::summary<unsigned> stats_data::get_write_count_summary() const
{
    return {
               file_stats_data_list_, [](const file_stats_data& fsd) {
                   return fsd.get_write_count();
               }
    };
}